

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatClauseVec.c
# Opt level: O2

void Msat_ClauseVecPush(Msat_ClauseVec_t *p,Msat_Clause_t *Entry)

{
  int iVar1;
  int nCapMin;
  
  iVar1 = p->nSize;
  if (iVar1 == p->nCap) {
    nCapMin = 0x10;
    if (0xf < iVar1) {
      nCapMin = iVar1 * 2;
    }
    Msat_ClauseVecGrow(p,nCapMin);
  }
  iVar1 = p->nSize;
  p->nSize = iVar1 + 1;
  p->pArray[iVar1] = Entry;
  return;
}

Assistant:

void Msat_ClauseVecPush( Msat_ClauseVec_t * p, Msat_Clause_t * Entry )
{
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Msat_ClauseVecGrow( p, 16 );
        else
            Msat_ClauseVecGrow( p, 2 * p->nCap );
    }
    p->pArray[p->nSize++] = Entry;
}